

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

TRexBool trex_searchrange(TRex *exp,char *text_begin,char *text_end,char **out_begin,char **out_end)

{
  char *pcVar1;
  bool local_45;
  int local_44;
  char *pcStack_40;
  int node;
  char *cur;
  char **out_end_local;
  char **out_begin_local;
  char *text_end_local;
  char *text_begin_local;
  TRex *exp_local;
  
  local_44 = exp->_first;
  if (text_begin < text_end) {
    exp->_bol = text_begin;
    exp->_eol = text_end;
    pcVar1 = text_begin;
    do {
      text_end_local = pcVar1;
      pcStack_40 = text_end_local;
      for (; local_44 != -1; local_44 = exp->_nodes[local_44].next) {
        exp->_currsubexp = 0;
        pcStack_40 = trex_matchnode(exp,exp->_nodes + local_44,pcStack_40,(TRexNode *)0x0);
        if (pcStack_40 == (char *)0x0) break;
      }
      local_45 = pcStack_40 == (char *)0x0 && text_end_local + 1 != text_end;
      pcVar1 = text_end_local + 1;
    } while (local_45);
    if (pcStack_40 == (char *)0x0) {
      exp_local._4_4_ = 0;
    }
    else {
      if (out_begin != (char **)0x0) {
        *out_begin = text_end_local;
      }
      if (out_end != (char **)0x0) {
        *out_end = pcStack_40;
      }
      exp_local._4_4_ = 1;
    }
  }
  else {
    exp_local._4_4_ = 0;
  }
  return exp_local._4_4_;
}

Assistant:

TRexBool trex_searchrange(TRex * exp, const TRexChar * text_begin, const TRexChar * text_end, const TRexChar ** out_begin, const TRexChar ** out_end) {
	const TRexChar * cur = NULL;
	int node = exp->_first;

	if (text_begin >= text_end) {
		return TRex_False;
	}

	exp->_bol = text_begin;
	exp->_eol = text_end;

	do {
		cur = text_begin;

		while (node != -1) {
			exp->_currsubexp = 0;
			cur = trex_matchnode(exp, &exp->_nodes[node], cur, NULL);

			if (!cur) {
				break;
			}

			node = exp->_nodes[node].next;
		}

		text_begin++;
	} while (cur == NULL && text_begin != text_end);

	if (cur == NULL) {
		return TRex_False;
	}

	--text_begin;

	if (out_begin) {
		*out_begin = text_begin;
	}

	if (out_end) {
		*out_end = cur;
	}

	return TRex_True;
}